

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGB1555ToYRow_C(uint8_t *src_argb1555,uint8_t *dst_y,int width)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar6;
  }
  for (; (int)uVar4 != (int)uVar6; uVar6 = uVar6 + 1) {
    bVar1 = src_argb1555[uVar6 * 2];
    bVar2 = src_argb1555[uVar6 * 2 + 1];
    bVar5 = bVar2 * '\b' | bVar1 >> 5;
    iVar3 = libyuv::RGBToY(bVar2 >> 4 & 7 | bVar2 * '\x02' & 0xf8,(bVar5 & 0x1c) >> 2 | bVar5 << 3,
                           bVar1 >> 2 & 7 | bVar1 * '\b');
    dst_y[uVar6] = (uint8_t)iVar3;
  }
  return;
}

Assistant:

void ARGB1555ToYRow_C(const uint8_t* src_argb1555, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb1555[0] & 0x1f;
    uint8_t g = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r = (src_argb1555[1] & 0x7c) >> 2;
    b = (b << 3) | (b >> 2);
    g = (g << 3) | (g >> 2);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_argb1555 += 2;
    dst_y += 1;
  }
}